

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Theory.cpp
# Opt level: O0

Option<Kernel::RationalConstantType> *
Kernel::parseExponentInteger(string *number,char *exponentChars)

{
  undefined1 uVar1;
  RationalConstantType *pRVar2;
  ulong in_RDX;
  char *in_RSI;
  Option<Kernel::RationalConstantType> *in_RDI;
  bool bVar3;
  int exp;
  Option<Kernel::RationalConstantType> base;
  size_type i;
  RationalConstantType *in_stack_fffffffffffffe78;
  RationalConstantType *in_stack_fffffffffffffe80;
  IntegerConstantType *in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe95;
  byte bVar4;
  undefined1 uVar5;
  Option<Kernel::RationalConstantType> *this;
  IntegerConstantType *in_stack_fffffffffffffed0;
  RationalConstantType *in_stack_fffffffffffffed8;
  RationalConstantType *in_stack_fffffffffffffef0;
  undefined6 in_stack_fffffffffffffef8;
  byte bVar6;
  byte bVar7;
  string local_98 [32];
  int local_78;
  string *in_stack_ffffffffffffff98;
  OptionBase<Kernel::RationalConstantType> local_48;
  long local_20;
  char *local_10;
  
  this = in_RDI;
  local_10 = in_RSI;
  local_20 = std::__cxx11::string::find_first_of(in_RSI,in_RDX);
  if (local_20 != -1) {
    std::__cxx11::string::substr((ulong)&stack0xffffffffffffff98,(ulong)local_10);
    parseRat(in_stack_ffffffffffffff98);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
    local_78 = 0;
    std::__cxx11::string::substr((ulong)local_98,(ulong)local_10);
    std::__cxx11::string::c_str();
    uVar1 = Lib::Int::stringToInt
                      ((char *)in_stack_fffffffffffffe88,(int *)in_stack_fffffffffffffe80);
    bVar4 = false;
    if ((bool)uVar1) {
      in_stack_fffffffffffffe95 = Lib::OptionBase<Kernel::RationalConstantType>::isSome(&local_48);
      bVar4 = in_stack_fffffffffffffe95;
    }
    uVar5 = bVar4;
    std::__cxx11::string::~string(local_98);
    if ((bVar4 & 1) == 0) {
      bVar3 = false;
    }
    else {
      bVar7 = 0;
      bVar6 = 0;
      bVar3 = local_78 < 0;
      if (bVar3) {
        in_stack_fffffffffffffe80 =
             Lib::Option<Kernel::RationalConstantType>::operator*
                       ((Option<Kernel::RationalConstantType> *)0x9b1f35);
        IntegerConstantType::IntegerConstantType
                  ((IntegerConstantType *)
                   CONCAT17(uVar1,CONCAT16(uVar5,CONCAT15(in_stack_fffffffffffffe95,
                                                          CONCAT14(bVar4,in_stack_fffffffffffffe90))
                                          )),(int)((ulong)in_stack_fffffffffffffe88 >> 0x20));
        IntegerConstantType::operator^((IntegerConstantType *)this,(unsigned_long)in_RDI);
        RationalConstantType::RationalConstantType
                  ((RationalConstantType *)
                   CONCAT17(uVar1,CONCAT16(uVar5,CONCAT15(in_stack_fffffffffffffe95,
                                                          CONCAT14(bVar4,in_stack_fffffffffffffe90))
                                          )),in_stack_fffffffffffffe88);
        RationalConstantType::operator/
                  ((RationalConstantType *)CONCAT17(bVar7,CONCAT16(bVar6,in_stack_fffffffffffffef8))
                   ,in_stack_fffffffffffffef0);
      }
      else {
        pRVar2 = Lib::Option<Kernel::RationalConstantType>::operator*
                           ((Option<Kernel::RationalConstantType> *)0x9b1e9e);
        RationalConstantType::RationalConstantType
                  ((RationalConstantType *)
                   CONCAT17(uVar1,CONCAT16(uVar5,CONCAT15(in_stack_fffffffffffffe95,
                                                          CONCAT14(bVar4,in_stack_fffffffffffffe90))
                                          )),pRVar2);
        IntegerConstantType::IntegerConstantType
                  ((IntegerConstantType *)
                   CONCAT17(uVar1,CONCAT16(uVar5,CONCAT15(in_stack_fffffffffffffe95,
                                                          CONCAT14(bVar4,in_stack_fffffffffffffe90))
                                          )),(int)((ulong)pRVar2 >> 0x20));
        bVar7 = 1;
        IntegerConstantType::operator^((IntegerConstantType *)this,(unsigned_long)in_RDI);
        bVar6 = 1;
        operator*(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
      }
      Lib::some<Kernel::RationalConstantType>(in_stack_fffffffffffffe78);
      RationalConstantType::~RationalConstantType(in_stack_fffffffffffffe80);
      if (bVar3) {
        RationalConstantType::~RationalConstantType(in_stack_fffffffffffffe80);
        IntegerConstantType::~IntegerConstantType((IntegerConstantType *)0x9b1ff1);
        IntegerConstantType::~IntegerConstantType((IntegerConstantType *)0x9b2004);
      }
      if ((bVar6 & 1) != 0) {
        IntegerConstantType::~IntegerConstantType((IntegerConstantType *)0x9b201d);
      }
      if ((bVar7 & 1) != 0) {
        IntegerConstantType::~IntegerConstantType((IntegerConstantType *)0x9b2036);
      }
      if (!bVar3) {
        RationalConstantType::~RationalConstantType(in_stack_fffffffffffffe80);
      }
      bVar3 = true;
    }
    Lib::Option<Kernel::RationalConstantType>::~Option
              ((Option<Kernel::RationalConstantType> *)0x9b2214);
    if (bVar3) {
      return this;
    }
  }
  memset(in_RDI,0,0x28);
  Lib::Option<Kernel::RationalConstantType>::Option
            ((Option<Kernel::RationalConstantType> *)0x9b224c);
  return this;
}

Assistant:

Option<RationalConstantType> parseExponentInteger(std::string const& number, const char* exponentChars) {
  auto i = number.find_first_of(exponentChars);
  if (i != std::string::npos) {
    auto base = parseRat(number.substr(0, i));
    int exp = 0;
    if (Int::stringToInt(number.substr(i + 1).c_str(), exp) && base.isSome()) {
      return some(
          exp >= 0 ? (*base) * (IntegerConstantType(10) ^ (unsigned long)exp)
                   : (*base) / RationalConstantType((IntegerConstantType(10) ^ (unsigned long)abs(exp))));
    }
  }
  return {};
}